

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header6.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Header6::Header6(Header6 *this)

{
  Header6 *this_local;
  
  this->_vptr_Header6 = (_func_int **)&PTR__Header6_0032bb30;
  this->m_ui8ProtocolVersion = '\0';
  this->m_ui8ExerciseID = '\0';
  this->m_ui8PDUType = '\0';
  this->m_ui8ProtocolFamily = '\0';
  DATA_TYPE::TimeStamp::TimeStamp(&this->m_TimeStamp);
  this->m_ui16PDULength = 0;
  this->m_ui8Padding1 = '\0';
  this->m_ui8Padding2 = '\0';
  return;
}

Assistant:

Header6::Header6() :
    m_ui8ProtocolVersion( 0 ),
    m_ui8ExerciseID( 0 ),
    m_ui8PDUType( 0 ),
    m_ui8ProtocolFamily( 0 ),
    m_ui16PDULength( 0 ),
    m_ui8Padding1( 0 ),
    m_ui8Padding2( 0 )
{
}